

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O0

void __thiscall DListMenu::Init(DListMenu *this,DMenu *parent,FListMenuDescriptor *desc)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  FListMenuItem **ppFVar4;
  uint local_3c;
  int width_1;
  uint i_1;
  int left;
  int curx;
  int width;
  int xpos;
  uint i;
  int center;
  FListMenuDescriptor *desc_local;
  DMenu *parent_local;
  DListMenu *this_local;
  
  TObjPtr<DMenu>::operator=(&(this->super_DMenu).mParentMenu,parent);
  GC::WriteBarrier((DObject *)this,&parent->super_DObject);
  this->mDesc = desc;
  if ((desc->mCenter & 1U) != 0) {
    xpos = 0xa0;
    for (width = 0;
        uVar1 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                          (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>),
        (uint)width < uVar1; width = width + 1) {
      ppFVar4 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                          (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                           (ulong)(uint)width);
      FListMenuItem::GetX(*ppFVar4);
      ppFVar4 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                          (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                           (ulong)(uint)width);
      iVar2 = (*(*ppFVar4)->_vptr_FListMenuItem[0x10])();
      iVar3 = this->mDesc->mSelectOfsX;
      if (0 < iVar2) {
        ppFVar4 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                            (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                             (ulong)(uint)width);
        uVar1 = (*(*ppFVar4)->_vptr_FListMenuItem[5])();
        if (((uVar1 & 1) != 0) && (iVar3 = (0xa0 - (iVar2 - iVar3) / 2) - iVar3, iVar3 < xpos)) {
          xpos = iVar3;
        }
      }
    }
    for (local_3c = 0;
        uVar1 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                          (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>),
        local_3c < uVar1; local_3c = local_3c + 1) {
      ppFVar4 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                          (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                           (ulong)local_3c);
      iVar3 = (*(*ppFVar4)->_vptr_FListMenuItem[0x10])();
      if (0 < iVar3) {
        ppFVar4 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                            (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                             (ulong)local_3c);
        FListMenuItem::SetX(*ppFVar4,xpos);
      }
    }
  }
  return;
}

Assistant:

void DListMenu::Init(DMenu *parent, FListMenuDescriptor *desc)
{
	mParentMenu = parent;
	GC::WriteBarrier(this, parent);
	mDesc = desc;
	if (desc->mCenter)
	{
		int center = 160;
		for(unsigned i=0;i<mDesc->mItems.Size(); i++)
		{
			int xpos = mDesc->mItems[i]->GetX();
			int width = mDesc->mItems[i]->GetWidth();
			int curx = mDesc->mSelectOfsX;

			if (width > 0 && mDesc->mItems[i]->Selectable())
			{
				int left = 160 - (width - curx) / 2 - curx;
				if (left < center) center = left;
			}
		}
		for(unsigned i=0;i<mDesc->mItems.Size(); i++)
		{
			int width = mDesc->mItems[i]->GetWidth();

			if (width > 0)
			{
				mDesc->mItems[i]->SetX(center);
			}
		}
	}
}